

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

int Au_NtkMemUsage(Au_Ntk_t *p)

{
  int Mem;
  Au_Ntk_t *p_local;
  
  return p->nObjsAlloc * 0x10 +
         (p->vObjs).nCap * 4 + (p->vPos).nCap * 4 + (p->vPis).nCap * 4 + 0x100;
}

Assistant:

int Au_NtkMemUsage( Au_Ntk_t * p )
{
    int Mem = sizeof(Au_Ntk_t);
    Mem += 4 * p->vPis.nCap;
    Mem += 4 * p->vPos.nCap;
    Mem += 4 * p->vObjs.nCap;
    Mem += 16 * p->nObjsAlloc;
    return Mem;
}